

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::Var::Var(Var *this,Generator *module,string *name,uint32_t var_width,uint32_t size,
                bool is_signed,VarType type)

{
  initializer_list<unsigned_int> __l;
  allocator<unsigned_int> local_5d;
  uint32_t local_5c;
  iterator local_58;
  size_type local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  byte local_29;
  uint32_t local_28;
  uint32_t uStack_24;
  bool is_signed_local;
  uint32_t size_local;
  uint32_t var_width_local;
  string *name_local;
  Generator *module_local;
  Var *this_local;
  
  local_58 = &local_5c;
  local_50 = 1;
  local_5c = size;
  local_29 = is_signed;
  local_28 = size;
  uStack_24 = var_width;
  _size_local = name;
  name_local = (string *)module;
  module_local = (Generator *)this;
  std::allocator<unsigned_int>::allocator(&local_5d);
  __l._M_len = local_50;
  __l._M_array = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__l,&local_5d);
  Var(this,module,name,var_width,&local_48,(bool)(local_29 & 1),type);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_48);
  std::allocator<unsigned_int>::~allocator(&local_5d);
  return;
}

Assistant:

Var::Var(Generator *module, const std::string &name, uint32_t var_width, uint32_t size,
         bool is_signed, VarType type)
    : Var(module, name, var_width, std::vector<uint32_t>{size}, is_signed, type) {}